

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observers.h
# Opt level: O2

void __thiscall
obs::observers<Observer>::notify_observers<int,int>
          (observers<Observer> *this,offset_in_observer_type_to_subr method,int args,int args_1)

{
  bool bVar1;
  Observer *pOVar2;
  long *plVar3;
  code *pcVar4;
  undefined4 in_register_00000014;
  undefined4 in_R8D;
  iterator __end0;
  iterator __begin0;
  iterator local_80;
  iterator local_58;
  
  safe_list<Observer>::begin(&local_58,&this->m_observers);
  safe_list<Observer>::end(&local_80,&this->m_observers);
  while( true ) {
    bVar1 = safe_list<Observer>::iterator::operator!=(&local_58,&local_80);
    if (!bVar1) break;
    pOVar2 = safe_list<Observer>::iterator::operator*(&local_58);
    if (pOVar2 != (Observer *)0x0) {
      plVar3 = (long *)((long)&pOVar2->_vptr_Observer + CONCAT44(in_register_00000014,args));
      pcVar4 = (code *)method;
      if ((method & 1) != 0) {
        pcVar4 = *(code **)(*plVar3 + -1 + method);
      }
      (*pcVar4)(plVar3,args_1,in_R8D);
    }
    safe_list<Observer>::iterator::operator++(&local_58);
  }
  safe_list<Observer>::iterator::~iterator(&local_80);
  safe_list<Observer>::iterator::~iterator(&local_58);
  return;
}

Assistant:

void notify_observers(void (observer_type::*method)(Args...), Args ...args) {
    for (auto observer : m_observers) {
      if (observer)
        (observer->*method)(std::forward<Args>(args)...);
    }
  }